

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O1

void __thiscall GlobOptBlockData::ReuseBlockData(GlobOptBlockData *this,GlobOptBlockData *fromData)

{
  GlobOpt *this_00;
  CapturedValues *this_01;
  bool bVar1;
  
  this_00 = fromData->globOpt;
  this->globOpt = this_00;
  this->symToValueMap = fromData->symToValueMap;
  this->exprToValueMap = fromData->exprToValueMap;
  this->liveFields = fromData->liveFields;
  this->liveArrayValues = fromData->liveArrayValues;
  this->maybeWrittenTypeSyms = fromData->maybeWrittenTypeSyms;
  this->isTempSrc = fromData->isTempSrc;
  this->liveVarSyms = fromData->liveVarSyms;
  this->liveInt32Syms = fromData->liveInt32Syms;
  this->liveLossyInt32Syms = fromData->liveLossyInt32Syms;
  this->liveFloat64Syms = fromData->liveFloat64Syms;
  bVar1 = GlobOpt::TrackArgumentsObject(this_00);
  if (bVar1) {
    this->argObjSyms = fromData->argObjSyms;
  }
  this->maybeTempObjectSyms = fromData->maybeTempObjectSyms;
  this->canStoreTempObjectSyms = fromData->canStoreTempObjectSyms;
  this->curFunc = fromData->curFunc;
  this->valuesToKillOnCalls = fromData->valuesToKillOnCalls;
  this->inductionVariables = fromData->inductionVariables;
  this->availableIntBoundChecks = fromData->availableIntBoundChecks;
  this->callSequence = fromData->callSequence;
  this->startCallCount = fromData->startCallCount;
  this->argOutCount = fromData->argOutCount;
  this->totalOutParamCount = fromData->totalOutParamCount;
  this->inlinedArgOutSize = fromData->inlinedArgOutSize;
  this->hasCSECandidates = fromData->hasCSECandidates;
  this->stackLiteralInitFldDataMap = fromData->stackLiteralInitFldDataMap;
  this->changedSyms = fromData->changedSyms;
  this_01 = fromData->capturedValues;
  this->capturedValues = this_01;
  if (this_01 != (CapturedValues *)0x0) {
    CapturedValues::IncrementRefCount(this_01);
  }
  this->hasDataRef = fromData->hasDataRef;
  return;
}

Assistant:

void
GlobOptBlockData::ReuseBlockData(GlobOptBlockData *fromData)
{
    this->globOpt = fromData->globOpt;

    // Reuse dead map
    this->symToValueMap = fromData->symToValueMap;
    this->exprToValueMap = fromData->exprToValueMap;
    this->liveFields = fromData->liveFields;
    this->liveArrayValues = fromData->liveArrayValues;
    this->maybeWrittenTypeSyms = fromData->maybeWrittenTypeSyms;
    this->isTempSrc = fromData->isTempSrc;
    this->liveVarSyms = fromData->liveVarSyms;
    this->liveInt32Syms = fromData->liveInt32Syms;
    this->liveLossyInt32Syms = fromData->liveLossyInt32Syms;
    this->liveFloat64Syms = fromData->liveFloat64Syms;

    if (this->globOpt->TrackArgumentsObject())
    {
        this->argObjSyms = fromData->argObjSyms;
    }
    this->maybeTempObjectSyms = fromData->maybeTempObjectSyms;
    this->canStoreTempObjectSyms = fromData->canStoreTempObjectSyms;
    this->curFunc = fromData->curFunc;

    this->valuesToKillOnCalls = fromData->valuesToKillOnCalls;
    this->inductionVariables = fromData->inductionVariables;
    this->availableIntBoundChecks = fromData->availableIntBoundChecks;
    this->callSequence = fromData->callSequence;

    this->startCallCount = fromData->startCallCount;
    this->argOutCount = fromData->argOutCount;
    this->totalOutParamCount = fromData->totalOutParamCount;
    this->inlinedArgOutSize = fromData->inlinedArgOutSize;
    this->hasCSECandidates = fromData->hasCSECandidates;

    this->stackLiteralInitFldDataMap = fromData->stackLiteralInitFldDataMap;

    this->changedSyms = fromData->changedSyms;
    this->capturedValues = fromData->capturedValues;
    if (this->capturedValues)
    {
        this->capturedValues->IncrementRefCount();
    }

    this->OnDataReused(fromData);
}